

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall cubeb_context_variables_Test::TestBody(cubeb_context_variables_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  cubeb_stream_params params;
  uint32_t value;
  cubeb *ctx;
  int r;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 uVar4;
  int *in_stack_fffffffffffffeb8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  AssertHelper in_stack_fffffffffffffec8;
  Message local_130;
  uint32_t *in_stack_fffffffffffffed8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  cubeb *in_stack_fffffffffffffee8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  AssertHelper in_stack_fffffffffffffef8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  String local_e8;
  AssertHelper local_d8;
  Message local_d0;
  AssertionResult local_c8;
  String local_b8;
  AssertHelper local_a8;
  Message local_a0;
  AssertionResult local_98;
  AssertHelper local_88;
  Message local_80;
  undefined8 local_78;
  AssertionResult local_70;
  uint local_5c;
  AssertHelper local_58;
  Message local_50;
  undefined4 local_44;
  AssertionResult local_40;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  int local_c;
  
  local_c = common_init((cubeb **)in_stack_fffffffffffffec0.ptr_,(char *)in_stack_fffffffffffffeb8);
  local_44 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            ((char *)in_stack_fffffffffffffec8.data_,(char *)in_stack_fffffffffffffec0.ptr_,
             in_stack_fffffffffffffeb8,
             (anon_enum_32 *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0.ptr_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10927f);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x1092cf);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1092f4);
  if (local_5c == 0) {
    local_78 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00.ptr_,
               (cubeb **)in_stack_fffffffffffffef8.data_,(void **)in_stack_fffffffffffffef0.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0.ptr_);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10936c);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x7c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message((Message *)0x1093bc);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1093e1);
    if (local_5c == 0) {
      local_28 = 1;
      local_30 = 0;
      local_2c = 0xac44;
      local_24 = 4;
      local_20 = 0;
      local_c = cubeb_get_min_latency
                          (in_stack_fffffffffffffee8,
                           (cubeb_stream_params *)in_stack_fffffffffffffee0.ptr_,
                           in_stack_fffffffffffffed8);
      uVar4 = local_c == 0 || local_c == -4;
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),
                 (bool)in_stack_fffffffffffffeaf);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0.ptr_);
        testing::internal::GetBoolAssertionFailureMessage
                  ((AssertionResult *)&local_b8,&local_98.success_,
                   "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false");
        pcVar2 = testing::internal::String::c_str(&local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,0x85,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        testing::internal::String::~String
                  ((String *)
                   CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
        testing::Message::~Message((Message *)0x10953d);
      }
      local_5c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x109562);
      if (local_5c == 0) {
        if (local_c == 0) {
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)
                     CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),
                     (bool)in_stack_fffffffffffffeaf);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffec0.ptr_);
            testing::internal::GetBoolAssertionFailureMessage
                      ((AssertionResult *)&local_e8,&local_c8.success_,"value > 0","false");
            pcVar2 = testing::internal::String::c_str(&local_e8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x87,pcVar2);
            testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_d8);
            testing::internal::String::~String
                      ((String *)
                       CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0))
                      );
            testing::Message::~Message((Message *)0x109650);
          }
          local_5c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x109675);
          if (local_5c != 0) {
            return;
          }
        }
        local_c = cubeb_get_preferred_sample_rate
                            ((cubeb *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                             (uint32_t *)0x10969e);
        uVar3 = local_c == 0 || local_c == -4;
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_fffffffffffffeb0)),
                   (bool)in_stack_fffffffffffffeaf);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff08);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffec0.ptr_);
          testing::internal::GetBoolAssertionFailureMessage
                    ((AssertionResult *)&stack0xfffffffffffffee8,&stack0xffffffffffffff08,
                     "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false");
          pcVar2 = testing::internal::String::c_str((String *)&stack0xfffffffffffffee8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffef8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,0x8b,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffef8,(Message *)&stack0xffffffffffffff00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
          testing::internal::String::~String
                    ((String *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_fffffffffffffeb0)));
          testing::Message::~Message((Message *)0x109770);
        }
        local_5c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x109792);
        if (local_5c == 0) {
          if (local_c == 0) {
            testing::AssertionResult::AssertionResult
                      ((AssertionResult *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_fffffffffffffeb0)),
                       (bool)in_stack_fffffffffffffeaf);
            bVar1 = testing::AssertionResult::operator_cast_to_bool
                              ((AssertionResult *)&stack0xfffffffffffffed8);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffec0.ptr_);
              testing::internal::GetBoolAssertionFailureMessage
                        ((AssertionResult *)&stack0xfffffffffffffeb8,&stack0xfffffffffffffed8,
                         "value > 0","false");
              pcVar2 = testing::internal::String::c_str((String *)&stack0xfffffffffffffeb8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffec8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                         ,0x8d,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xfffffffffffffec8,&local_130);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffec8);
              testing::internal::String::~String
                        ((String *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_fffffffffffffeb0)));
              testing::Message::~Message((Message *)0x109865);
            }
            local_5c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x109887);
            if (local_5c != 0) {
              return;
            }
          }
          cubeb_destroy((cubeb *)0x1098a5);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, context_variables)
{
  int r;
  cubeb * ctx;
  uint32_t value;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_context_variables");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.channels = STREAM_CHANNELS;
  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_get_min_latency(ctx, &params, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  cubeb_destroy(ctx);
}